

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit_suite.cpp
# Opt level: O2

void implicit_value_suite::visit_array(void)

{
  visitor vis;
  variable data;
  visitor local_41;
  undefined4 local_40;
  value local_3c;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_38;
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_3c = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                       (&local_41,(basic_variable<std::allocator<char>_> *)&local_38);
  local_40 = 0x13;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x1a4,"void implicit_value_suite::visit_array()",&local_3c,&local_40);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_38);
  return;
}

Assistant:

void visit_array()
{
    variable data = array::make();
    visitor vis;
    TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::array);
}